

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

string * helics::newDestGeneration
                   (string *__return_storage_ptr__,string *src,string *dest,string *formula)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n;
  pointer pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  undefined8 uVar5;
  void *pvVar6;
  regex destreg;
  regex srcreg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  __n = formula->_M_string_length;
  if ((__n != 0) &&
     (pcVar3 = (formula->_M_dataplus)._M_p, pvVar6 = memchr(pcVar3,0x24,__n),
     pvVar6 != (void *)0x0 && (long)pvVar6 - (long)pcVar3 != -1)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_50,"\\$\\{source\\}",0x10);
    paVar2 = &local_b0.field_2;
    pcVar3 = (src->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + src->_M_string_length);
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    _Var4._M_current = (formula->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::
    __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,_Var4,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(_Var4._M_current + formula->_M_string_length),&local_50,local_b0._M_dataplus._M_p,
               local_b0._M_string_length,0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)formula,
               &local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_90,"\\$\\{dest\\}",
               0x10);
    pcVar3 = (dest->_M_dataplus)._M_p;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + dest->_M_string_length);
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    _Var4._M_current = (formula->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::
    __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,_Var4,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(_Var4._M_current + formula->_M_string_length),
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_90,(char *)local_70,
               local_68,0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)formula,
               &local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (formula->_M_dataplus)._M_p;
    paVar1 = &formula->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar5 = *(undefined8 *)((long)&formula->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = formula->_M_string_length;
    (formula->_M_dataplus)._M_p = (pointer)paVar1;
    formula->_M_string_length = 0;
    (formula->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_90);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (formula->_M_dataplus)._M_p;
  paVar1 = &formula->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar5 = *(undefined8 *)((long)&formula->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = __n;
  (formula->_M_dataplus)._M_p = (pointer)paVar1;
  formula->_M_string_length = 0;
  (formula->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string newDestGeneration(const std::string& src, const std::string& dest, std::string formula)
{
    if (formula.find_first_of('$') == std::string::npos) {
        return formula;
    }
    const std::regex srcreg(R"(\$\{source\})");
    formula = std::regex_replace(formula, srcreg, std::string{src});
    const std::regex destreg(R"(\$\{dest\})");
    formula = std::regex_replace(formula, destreg, std::string{dest});
    return formula;
}